

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilCountPairsAll(Sym_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Extra_BitMat_t *pEVar5;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  abctime clk;
  int i;
  int nPairsNonSym;
  int nPairsSym;
  int nPairsTotal;
  Sym_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  p->nPairsSymm = 0;
  p->nPairsNonSymm = 0;
  clk._0_4_ = 0;
  while( true ) {
    if (p->nOutputs <= (int)clk) {
      p->nPairsRem = (p->nPairsTotal - p->nPairsSymm) - p->nPairsNonSymm;
      aVar7 = Abc_Clock();
      p->timeCount = (aVar7 - aVar4) + p->timeCount;
      return;
    }
    iVar1 = Vec_IntEntry(p->vPairsTotal,(int)clk);
    iVar2 = Vec_IntEntry(p->vPairsSym,(int)clk);
    iVar3 = Vec_IntEntry(p->vPairsNonSym,(int)clk);
    if (iVar1 < iVar2 + iVar3) break;
    if (iVar1 == iVar2 + iVar3) {
      p->nPairsSymm = iVar2 + p->nPairsSymm;
      p->nPairsNonSymm = iVar3 + p->nPairsNonSymm;
    }
    else {
      pEVar5 = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,(int)clk);
      pVVar6 = Vec_VecEntryInt(p->vSupports,(int)clk);
      iVar2 = Sim_UtilCountPairsOne(pEVar5,pVVar6);
      pEVar5 = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,(int)clk);
      pVVar6 = Vec_VecEntryInt(p->vSupports,(int)clk);
      iVar3 = Sim_UtilCountPairsOne(pEVar5,pVVar6);
      if (iVar1 < iVar2 + iVar3) {
        __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                      ,0x2a8,"void Sim_UtilCountPairsAll(Sym_Man_t *)");
      }
      Vec_IntWriteEntry(p->vPairsSym,(int)clk,iVar2);
      Vec_IntWriteEntry(p->vPairsNonSym,(int)clk,iVar3);
      p->nPairsSymm = iVar2 + p->nPairsSymm;
      p->nPairsNonSymm = iVar3 + p->nPairsNonSymm;
    }
    clk._0_4_ = (int)clk + 1;
  }
  __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                ,0x29f,"void Sim_UtilCountPairsAll(Sym_Man_t *)");
}

Assistant:

void Sim_UtilCountPairsAll( Sym_Man_t * p )
{
    int nPairsTotal, nPairsSym, nPairsNonSym, i;
    abctime clk;
clk = Abc_Clock();
    p->nPairsSymm    = 0;
    p->nPairsNonSymm = 0;
    for ( i = 0; i < p->nOutputs; i++ )
    {
        nPairsTotal  = Vec_IntEntry(p->vPairsTotal, i);
        nPairsSym    = Vec_IntEntry(p->vPairsSym,   i);
        nPairsNonSym = Vec_IntEntry(p->vPairsNonSym,i);
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        if ( nPairsTotal == nPairsSym + nPairsNonSym )
        {
            p->nPairsSymm    += nPairsSym;
            p->nPairsNonSymm += nPairsNonSym;
            continue;
        }
        nPairsSym    = Sim_UtilCountPairsOne( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,   i), Vec_VecEntryInt(p->vSupports, i) );
        nPairsNonSym = Sim_UtilCountPairsOne( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,i), Vec_VecEntryInt(p->vSupports, i) );
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        Vec_IntWriteEntry( p->vPairsSym,    i, nPairsSym );
        Vec_IntWriteEntry( p->vPairsNonSym, i, nPairsNonSym );
        p->nPairsSymm    += nPairsSym;
        p->nPairsNonSymm += nPairsNonSym;
//        printf( "%d ", nPairsTotal - nPairsSym - nPairsNonSym );
    }
//printf( "\n" );
    p->nPairsRem = p->nPairsTotal-p->nPairsSymm-p->nPairsNonSymm;
p->timeCount += Abc_Clock() - clk;
}